

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O1

int __thiscall QObject::startTimer(QObject *this,milliseconds time,TimerType timerType)

{
  int iVar1;
  nanoseconds interval;
  
  interval.__r = time.__r * 1000000;
  if (SEXT816(interval.__r) != SEXT816(time.__r) * SEXT416(1000000)) {
    startTimer();
    interval.__r = 0x7fffffffffffffff;
  }
  iVar1 = startTimer(this,interval,timerType);
  return iVar1;
}

Assistant:

int QObject::startTimer(std::chrono::milliseconds time, Qt::TimerType timerType)
{
    using namespace std::chrono;
    using ratio = std::ratio_divide<std::milli, std::nano>;
    nanoseconds::rep r;
    if (qMulOverflow<ratio::num>(time.count(), &r)) {
        qWarning("QObject::startTimer(std::chrono::milliseconds): "
                 "'time' arg overflowed when converted to nanoseconds.");
        r = nanoseconds::max().count();
    }
    return startTimer(nanoseconds{r}, timerType);
}